

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::vector<pbrt::AliasTable::Bin,_pstd::pmr::polymorphic_allocator<pbrt::AliasTable::Bin>_>::
~vector(vector<pbrt::AliasTable::Bin,_pstd::pmr::polymorphic_allocator<pbrt::AliasTable::Bin>_>
        *this)

{
  vector<pbrt::AliasTable::Bin,_pstd::pmr::polymorphic_allocator<pbrt::AliasTable::Bin>_> *in_RDI;
  Bin *in_stack_ffffffffffffffe8;
  
  clear(in_RDI);
  pmr::polymorphic_allocator<pbrt::AliasTable::Bin>::deallocate_object<pbrt::AliasTable::Bin>
            (&in_RDI->alloc,in_stack_ffffffffffffffe8,0x538e3c);
  return;
}

Assistant:

~vector() {
        clear();
        alloc.deallocate_object(ptr, nAlloc);
    }